

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O2

_Bool os_direxists(char *filepath)

{
  int iVar1;
  uint *puVar2;
  _Bool _Var3;
  stat st;
  
  iVar1 = stat(filepath,(stat *)&st);
  if (iVar1 == -1) {
    puVar2 = (uint *)__errno_location();
    if ((0x14 < *puVar2) || ((0x102004U >> (*puVar2 & 0x1f) & 1) == 0)) {
      perror("fexists failure");
      exit(1);
    }
    _Var3 = false;
  }
  else {
    _Var3 = (st.st_mode & 0xf000) == 0x4000;
  }
  return _Var3;
}

Assistant:

bool os_direxists(char *filepath) {
    bool result = false;
#if defined(__linux__) || defined(__FreeBSD__) || defined(__OpenBSD__) ||      \
    defined(__NetBSD__) || defined(__DragonFly__)
    struct stat st;
    int stres = stat(filepath, &st);

    if (stres == -1) {
        if (errno == ENOENT || errno == EACCES || errno == ENOTDIR) {
            return false;
        }
        perror("fexists failure");
        exit(EXIT_FAILURE);
    } else {
        if (S_ISDIR(st.st_mode)) {
            return true;
        } else {
            return false;
        }
    }
#elif __APPLE__
#error "TODO os_fexists for APPLE platform"
#else
#error "TODO os_fexists for WINDOWS platform"
#endif

    return result;
}